

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::ResultBuilder::reconstructExpression_abi_cxx11_(ResultBuilder *this)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  char *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  string local_30 [48];
  
  __rhs = in_RDI;
  bVar1 = std::operator==(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  if (bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     in_stack_fffffffffffffde0);
    }
    else {
      std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 0x48));
    }
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    if (bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (char *)local_30);
      std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      std::__cxx11::string::~string(local_30);
    }
    else {
      bVar1 = std::operator!=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      if (bVar1) {
        lVar3 = std::__cxx11::string::size();
        lVar4 = std::__cxx11::string::size();
        if ((((ulong)(lVar3 + lVar4) < 0x28) &&
            (lVar3 = std::__cxx11::string::find((char *)(in_RSI + 0xc0),0x1cec8c), lVar3 == -1)) &&
           (lVar3 = std::__cxx11::string::find((char *)(in_RSI + 0xe0),0x1cec8c), lVar3 == -1)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI
                         ,(char *)in_stack_fffffffffffffde0);
          std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
          std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
          std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
          std::__cxx11::string::~string(local_60);
          std::__cxx11::string::~string(local_80);
          std::__cxx11::string::~string(local_a0);
        }
        else {
          pbVar5 = local_100;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI
                         ,(char *)in_stack_fffffffffffffde0);
          std::operator+(pbVar5,in_stack_fffffffffffffdc0);
          std::operator+(pbVar5,(char *)in_stack_fffffffffffffdc0);
          std::operator+(pbVar5,in_stack_fffffffffffffdc0);
          std::__cxx11::string::~string(local_c0);
          std::__cxx11::string::~string(local_e0);
          std::__cxx11::string::~string((string *)local_100);
        }
      }
      else {
        pbVar5 = local_1e0;
        std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
        std::operator+(in_stack_fffffffffffffdc8,(char *)pbVar5);
        std::__cxx11::string::substr((ulong)&stack0xfffffffffffffe00,(ulong)(in_RSI + 0x48));
        std::operator+(in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __rhs);
        std::operator+(in_stack_fffffffffffffdc8,(char *)pbVar5);
        std::operator+(in_stack_fffffffffffffdc8,pbVar5);
        std::operator+(in_stack_fffffffffffffdc8,(char *)pbVar5);
        std::operator+(in_stack_fffffffffffffdc8,pbVar5);
        std::operator+(in_stack_fffffffffffffdc8,(char *)pbVar5);
        std::__cxx11::string::~string(local_120);
        std::__cxx11::string::~string(local_140);
        std::__cxx11::string::~string(local_160);
        std::__cxx11::string::~string(local_180);
        std::__cxx11::string::~string(local_1a0);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
        std::__cxx11::string::~string(local_1c0);
        std::__cxx11::string::~string((string *)local_1e0);
      }
    }
  }
  return __rhs;
}

Assistant:

std::string ResultBuilder::reconstructExpression() const {
        if( m_exprComponents.op == "" )
            return m_exprComponents.lhs.empty() ? m_assertionInfo.capturedExpression : m_exprComponents.op + m_exprComponents.lhs;
        else if( m_exprComponents.op == "matches" )
            return m_exprComponents.lhs + " " + m_exprComponents.rhs;
        else if( m_exprComponents.op != "!" ) {
            if( m_exprComponents.lhs.size() + m_exprComponents.rhs.size() < 40 &&
                m_exprComponents.lhs.find("\n") == std::string::npos &&
                m_exprComponents.rhs.find("\n") == std::string::npos )
                return m_exprComponents.lhs + " " + m_exprComponents.op + " " + m_exprComponents.rhs;
            else
                return m_exprComponents.lhs + "\n" + m_exprComponents.op + "\n" + m_exprComponents.rhs;
        }
        else
            return "{can't expand - use " + m_assertionInfo.macroName + "_FALSE( " + m_assertionInfo.capturedExpression.substr(1) + " ) instead of " + m_assertionInfo.macroName + "( " + m_assertionInfo.capturedExpression + " ) for better diagnostics}";
    }